

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

bool __thiscall
slang::ast::UnaryExpression::propagateType(UnaryExpression *this,ASTContext *context,Type *newType)

{
  Type *newType_00;
  Type *context_00;
  logic_error *this_00;
  string local_118;
  allocator<char> local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  SourceLocation local_40;
  Type *local_38;
  Type *local_30;
  Type *local_28;
  Type *newType_local;
  ASTContext *context_local;
  UnaryExpression *this_local;
  
  local_28 = newType;
  newType_local = (Type *)context;
  context_local = (ASTContext *)this;
  if (this->op < BitwiseAnd) {
    local_38 = newType;
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
              ((not_null<slang::ast::Type_const*> *)&local_30,&local_38);
    context_00 = newType_local;
    newType_00 = local_28;
    (this->super_Expression).type.ptr = local_30;
    SourceLocation::SourceLocation(&local_40);
    Expression::contextDetermined((ASTContext *)context_00,&this->operand_,newType_00,local_40);
    this_local._7_1_ = true;
  }
  else {
    if (10 < this->op - BitwiseAnd) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
                 ,&local_e1);
      std::operator+(&local_c0,&local_e0,":");
      std::__cxx11::to_string(&local_118,0x1b5);
      std::operator+(&local_a0,&local_c0,&local_118);
      std::operator+(&local_80,&local_a0,": ");
      std::operator+(&local_60,&local_80,"Default case should be unreachable!");
      std::logic_error::logic_error(this_00,(string *)&local_60);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool UnaryExpression::propagateType(const ASTContext& context, const Type& newType) {
    switch (op) {
        case UnaryOperator::Plus:
        case UnaryOperator::Minus:
        case UnaryOperator::BitwiseNot:
            type = &newType;
            contextDetermined(context, operand_, newType);
            return true;
        case UnaryOperator::BitwiseAnd:
        case UnaryOperator::BitwiseOr:
        case UnaryOperator::BitwiseXor:
        case UnaryOperator::BitwiseNand:
        case UnaryOperator::BitwiseNor:
        case UnaryOperator::BitwiseXnor:
        case UnaryOperator::LogicalNot:
        case UnaryOperator::Preincrement:
        case UnaryOperator::Predecrement:
        case UnaryOperator::Postincrement:
        case UnaryOperator::Postdecrement:
            // Operand is self determined and already folded.
            return false;
    }
    ASSUME_UNREACHABLE;
}